

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QEditorInfo * __thiscall
QAbstractItemViewPrivate::editorForIndex(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  Data *pDVar1;
  Span *pSVar2;
  ulong uVar3;
  QEditorInfo *pQVar4;
  long in_FS_OFFSET;
  const_iterator cVar5;
  QPersistentModelIndex local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (editorForIndex(QModelIndex_const&)::nullInfo == '\0') {
    editorForIndex();
  }
  pDVar1 = (this->indexEditorHash).d;
  pQVar4 = &editorForIndex::nullInfo;
  if ((pDVar1 != (Data *)0x0) && (pDVar1->size != 0)) {
    QPersistentModelIndex::QPersistentModelIndex(&local_30,index);
    cVar5 = QHash<QPersistentModelIndex,_QEditorInfo>::constFindImpl<QPersistentModelIndex>
                      (&this->indexEditorHash,&local_30);
    QPersistentModelIndex::~QPersistentModelIndex(&local_30);
    if (cVar5.i.d != (Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)0x0 ||
        cVar5.i.bucket != 0) {
      pSVar2 = (cVar5.i.d)->spans;
      uVar3 = cVar5.i.bucket >> 7;
      pQVar4 = (QEditorInfo *)
               (pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)cVar5.i.bucket & 0x7f]].storage.
                data + 8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

const QEditorInfo & QAbstractItemViewPrivate::editorForIndex(const QModelIndex &index) const
{
    static QEditorInfo nullInfo;

    // do not try to search to avoid slow implicit cast from QModelIndex to QPersistentModelIndex
    if (indexEditorHash.isEmpty())
        return nullInfo;

    QIndexEditorHash::const_iterator it = indexEditorHash.find(index);
    if (it == indexEditorHash.end())
        return nullInfo;

    return it.value();
}